

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O3

void __thiscall lambda::parse_from::helper::unexpected_thing(helper *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 *puVar4;
  string_view s;
  string_view s_00;
  Shared_string local_48;
  Shared_string local_30;
  
  iVar3 = std::istream::peek();
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x20);
  if (iVar3 == -1) {
    s._M_str = "unexpected end of file";
    s._M_len = 0x16;
    ublib::Shared_string::Shared_string(&local_30,s);
    *puVar4 = &PTR__Parse_error_00109ba8;
    puVar4[1] = local_30.length_;
    uVar1 = local_30.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._0_4_;
    uVar2 = local_30.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_;
    local_30.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined4 *)(puVar4 + 2) =
         local_30.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr.
         _0_4_;
    *(undefined4 *)((long)puVar4 + 0x14) =
         local_30.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr.
         _4_4_;
    *(undefined4 *)(puVar4 + 3) = uVar1;
    *(undefined4 *)((long)puVar4 + 0x1c) = uVar2;
    local_30.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    __cxa_throw(puVar4,&Parse_error::typeinfo,Parse_error::~Parse_error);
  }
  s_00._M_str = "unexpected character";
  s_00._M_len = 0x14;
  ublib::Shared_string::Shared_string(&local_48,s_00);
  *puVar4 = &PTR__Parse_error_00109ba8;
  puVar4[1] = local_48.length_;
  uVar1 = local_48.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._0_4_;
  uVar2 = local_48.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_;
  local_48.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)(puVar4 + 2) =
       local_48.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr.
       _0_4_;
  *(undefined4 *)((long)puVar4 + 0x14) =
       local_48.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr.
       _4_4_;
  *(undefined4 *)(puVar4 + 3) = uVar1;
  *(undefined4 *)((long)puVar4 + 0x1c) = uVar2;
  local_48.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  __cxa_throw(puVar4,&Parse_error::typeinfo,Parse_error::~Parse_error);
}

Assistant:

[[noreturn]] void unexpected_thing() {
      if (inp.peek() == eof) {
        throw Parse_error("unexpected end of file");
      } else {
        throw Parse_error("unexpected character");
      }
    }